

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O0

int allow_show_existing(AV1_COMP *cpi,uint frame_flags)

{
  lookahead_entry *plVar1;
  uint in_ESI;
  long *in_RDI;
  bool bVar2;
  bool bVar3;
  int is_key_frame;
  int is_s_frame;
  int is_error_resilient;
  lookahead_entry *lookahead_src;
  bool local_30;
  bool local_2f;
  uint local_4;
  
  if ((int)in_RDI[0x77f2] == 0) {
    local_4 = 0;
  }
  else {
    plVar1 = av1_lookahead_peek(*(lookahead_ctx **)(*in_RDI + 0x170),0,
                                (COMPRESSOR_STAGE)in_RDI[0x13a98]);
    if (plVar1 == (lookahead_entry *)0x0) {
      local_4 = 1;
    }
    else {
      bVar2 = true;
      if ((*(byte *)((long)in_RDI + 0x42442) & 1) == 0) {
        bVar2 = (plVar1->flags & 0x10000000U) != 0;
      }
      bVar3 = true;
      if ((*(byte *)((long)in_RDI + 0x42389) & 1) == 0) {
        bVar3 = (plVar1->flags & 0x20000000U) != 0;
      }
      local_2f = *(int *)((long)in_RDI + 0x6079c) == 0 || (in_ESI & 1) != 0;
      if ((bVar2) || (local_30 = true, bVar3)) {
        local_30 = local_2f;
      }
      local_4 = (uint)local_30;
    }
  }
  return local_4;
}

Assistant:

static int allow_show_existing(const AV1_COMP *const cpi,
                               unsigned int frame_flags) {
  if (cpi->common.current_frame.frame_number == 0) return 0;

  const struct lookahead_entry *lookahead_src =
      av1_lookahead_peek(cpi->ppi->lookahead, 0, cpi->compressor_stage);
  if (lookahead_src == NULL) return 1;

  const int is_error_resilient =
      cpi->oxcf.tool_cfg.error_resilient_mode ||
      (lookahead_src->flags & AOM_EFLAG_ERROR_RESILIENT);
  const int is_s_frame = cpi->oxcf.kf_cfg.enable_sframe ||
                         (lookahead_src->flags & AOM_EFLAG_SET_S_FRAME);
  const int is_key_frame =
      (cpi->rc.frames_to_key == 0) || (frame_flags & FRAMEFLAGS_KEY);
  return !(is_error_resilient || is_s_frame) || is_key_frame;
}